

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O0

void __thiscall ADynamicLight::UnlinkLight(ADynamicLight *this)

{
  bool bVar1;
  AActor *pAVar2;
  TObjPtr<AActor> *this_00;
  FLightNode *pFVar3;
  uint local_14;
  int c;
  ADynamicLight *this_local;
  
  if (((this->owned & 1U) != 0) &&
     (bVar1 = TObjPtr<AActor>::operator!=(&(this->super_AActor).target,(AActor *)0x0), bVar1)) {
    pAVar2 = TObjPtr<AActor>::operator->(&(this->super_AActor).target);
    local_14 = TArray<TObjPtr<AActor>,_TObjPtr<AActor>_>::Size(&pAVar2->dynamiclights);
    do {
      local_14 = local_14 - 1;
      if ((int)local_14 < 0) goto LAB_004526f3;
      pAVar2 = TObjPtr<AActor>::operator->(&(this->super_AActor).target);
      this_00 = TArray<TObjPtr<AActor>,_TObjPtr<AActor>_>::operator[]
                          (&pAVar2->dynamiclights,(long)(int)local_14);
      bVar1 = TObjPtr<AActor>::operator==(this_00,&this->super_AActor);
    } while (!bVar1);
    pAVar2 = TObjPtr<AActor>::operator->(&(this->super_AActor).target);
    TArray<TObjPtr<AActor>,_TObjPtr<AActor>_>::Delete(&pAVar2->dynamiclights,local_14);
  }
LAB_004526f3:
  while (this->touching_sides != (FLightNode *)0x0) {
    pFVar3 = DeleteLightNode(this->touching_sides);
    this->touching_sides = pFVar3;
  }
  while (this->touching_subsectors != (FLightNode *)0x0) {
    pFVar3 = DeleteLightNode(this->touching_subsectors);
    this->touching_subsectors = pFVar3;
  }
  while (this->touching_sector != (FLightNode *)0x0) {
    pFVar3 = DeleteLightNode(this->touching_sector);
    this->touching_sector = pFVar3;
  }
  return;
}

Assistant:

void ADynamicLight::UnlinkLight ()
{
	if (owned && target != NULL)
	{
		// Delete reference in owning actor
		for(int c=target->dynamiclights.Size()-1; c>=0; c--)
		{
			if (target->dynamiclights[c] == this)
			{
				target->dynamiclights.Delete(c);
				break;
			}
		}
	}
	while (touching_sides) touching_sides = DeleteLightNode(touching_sides);
	while (touching_subsectors) touching_subsectors = DeleteLightNode(touching_subsectors);
	while (touching_sector) touching_sector = DeleteLightNode(touching_sector);
}